

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O1

void stbi_decode_DXT45_alpha_block(uchar *uncompressed,uchar *compressed)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  uchar decode_alpha [8];
  
  decode_alpha[0] = *compressed;
  decode_alpha[1] = compressed[1];
  iVar5 = (uint)decode_alpha[1] + (uint)decode_alpha[1] * 2;
  uVar7 = (ushort)decode_alpha[0];
  uVar3 = (ushort)decode_alpha[1];
  if (decode_alpha[1] < decode_alpha[0]) {
    decode_alpha[2] =
         (uchar)((ulong)((uint)decode_alpha[1] + (uint)decode_alpha[0] * 6) * 0x24924925 >> 0x20);
    uVar4 = (uint)uVar7;
    decode_alpha[3] =
         (uchar)(((uint)decode_alpha[1] + (uint)decode_alpha[1] + (uint)uVar7 + (uint)uVar7 * 4) / 7
                );
    decode_alpha[4] = (uchar)((iVar5 + uVar4 * 4) * 0x2493 >> 0x10);
    decode_alpha[5] = (uchar)((uVar4 * 3 + (uint)uVar3 * 4) / 7);
    decode_alpha[6] = (uchar)(((uint)uVar3 + (uint)uVar3 * 4 + uVar4 * 2) * 0x2493 >> 0x10);
    decode_alpha[7] = (uchar)(((uint)uVar3 * 6 + uVar4) / 7);
  }
  else {
    decode_alpha[2] =
         (uchar)((ulong)((uint)decode_alpha[1] + (uint)decode_alpha[0] * 4) * 0x33333334 >> 0x20);
    decode_alpha[3] =
         (uchar)(((uint)decode_alpha[1] + (uint)decode_alpha[1] + (uint)uVar7 + (uint)uVar7 * 2) / 5
                );
    decode_alpha[4] = (uchar)((iVar5 + (uint)uVar7 * 2) * 0x3334 >> 0x10);
    decode_alpha[5] = (uchar)(((uint)uVar7 + (uint)uVar3 * 4) * 0x3334 >> 0x10);
    decode_alpha[6] = '\0';
    decode_alpha[7] = 0xff;
  }
  uVar4 = 0x10;
  uVar8 = 0xffffffffffffffff;
  do {
    uVar6 = uVar4 >> 3;
    uVar9 = uVar4 & 7;
    uVar1 = uVar4 + 1;
    uVar2 = uVar4 + 2;
    uVar4 = uVar4 + 3;
    uncompressed[uVar8 + 4] =
         decode_alpha
         [(uint)((compressed[uVar6] >> uVar9 & 1) != 0) +
          (compressed[uVar1 >> 3] >> ((byte)uVar1 & 7) & 1) * 2 +
          (compressed[uVar2 >> 3] >> ((byte)uVar2 & 7) & 1) * 4];
    uVar8 = uVar8 + 4;
  } while (uVar8 < 0x3c);
  return;
}

Assistant:

void stbi_decode_DXT45_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 8*2;
	unsigned char decode_alpha[8];
	//	each alpha value gets 3 bits, and the 1st 2 bytes are the range
	decode_alpha[0] = compressed[0];
	decode_alpha[1] = compressed[1];
	if( decode_alpha[0] > decode_alpha[1] )
	{
		//	6 step intermediate
		decode_alpha[2] = (6*decode_alpha[0] + 1*decode_alpha[1]) / 7;
		decode_alpha[3] = (5*decode_alpha[0] + 2*decode_alpha[1]) / 7;
		decode_alpha[4] = (4*decode_alpha[0] + 3*decode_alpha[1]) / 7;
		decode_alpha[5] = (3*decode_alpha[0] + 4*decode_alpha[1]) / 7;
		decode_alpha[6] = (2*decode_alpha[0] + 5*decode_alpha[1]) / 7;
		decode_alpha[7] = (1*decode_alpha[0] + 6*decode_alpha[1]) / 7;
	} else
	{
		//	4 step intermediate, pluss full and none
		decode_alpha[2] = (4*decode_alpha[0] + 1*decode_alpha[1]) / 5;
		decode_alpha[3] = (3*decode_alpha[0] + 2*decode_alpha[1]) / 5;
		decode_alpha[4] = (2*decode_alpha[0] + 3*decode_alpha[1]) / 5;
		decode_alpha[5] = (1*decode_alpha[0] + 4*decode_alpha[1]) / 5;
		decode_alpha[6] = 0;
		decode_alpha[7] = 255;
	}
	for( i = 3; i < 16*4; i += 4 )
	{
		int idx = 0, bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 0;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 1;
		++next_bit;
		bit = (compressed[next_bit>>3] >> (next_bit&7)) & 1;
		idx += bit << 2;
		++next_bit;
		uncompressed[i] = decode_alpha[idx & 7];
	}
	//	done
}